

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[45],kj::CappedArray<char,17ul>&,char_const(&)[8],kj::Array<kj::StringTree>,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [45],
          CappedArray<char,_17UL> *params_1,char (*params_2) [8],Array<kj::StringTree> *params_3,
          char (*params_4) [4])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  StringTree local_70;
  ArrayPtr<const_char> local_38;
  
  local_80 = toCharSequence<char_const(&)[45]>((char (*) [45])this);
  local_90.size_ = *(size_t *)*params;
  local_90.ptr = *params + 8;
  local_a0 = toCharSequence<char_const(&)[8]>((char (*) [8])params_1);
  operator*(&local_70,params_2);
  local_38 = toCharSequence<char_const(&)[4]>((char (*) [4])params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_80,&local_90,&local_a0,
             (ArrayPtr<const_char> *)&local_70,(StringTree *)&local_38,in_stack_ffffffffffffff58);
  StringTree::~StringTree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}